

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall
embree::SceneGraph::SubdivMeshNode::SubdivMeshNode
          (SubdivMeshNode *this,Ref<embree::SceneGraph::SubdivMeshNode> *imesh,
          Transformations *spaces)

{
  MaterialNode *pMVar1;
  
  (this->super_Node).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Node).fileName._M_dataplus._M_p = (pointer)&(this->super_Node).fileName.field_2;
  (this->super_Node).fileName._M_string_length = 0;
  (this->super_Node).fileName.field_2._M_local_buf[0] = '\0';
  (this->super_Node).name._M_dataplus._M_p = (pointer)&(this->super_Node).name.field_2;
  (this->super_Node).name._M_string_length = 0;
  (this->super_Node).name.field_2._M_local_buf[0] = '\0';
  (this->super_Node).indegree = 0;
  (this->super_Node).closed = true;
  (this->super_Node).hasLightOrCamera = false;
  (this->super_Node).id = 0xffffffff;
  (this->super_Node).geometry = (void *)0x0;
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__SubdivMeshNode_002c69f0;
  this->time_range = imesh->ptr->time_range;
  transformMSMBlurVec3faBuffer(&this->positions,&imesh->ptr->positions,spaces);
  transformMSMBlurNormalBuffer<embree::Vec3fa>(&this->normals,&imesh->ptr->normals,spaces);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::vector
            (&this->texcoords,&imesh->ptr->texcoords);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->position_indices,&imesh->ptr->position_indices);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->normal_indices,&imesh->ptr->normal_indices);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->texcoord_indices,&imesh->ptr->texcoord_indices);
  this->position_subdiv_mode = imesh->ptr->position_subdiv_mode;
  this->normal_subdiv_mode = imesh->ptr->normal_subdiv_mode;
  this->texcoord_subdiv_mode = imesh->ptr->texcoord_subdiv_mode;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->verticesPerFace,&imesh->ptr->verticesPerFace);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->holes,&imesh->ptr->holes);
  std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::vector
            (&this->edge_creases,&imesh->ptr->edge_creases);
  std::vector<float,_std::allocator<float>_>::vector
            (&this->edge_crease_weights,&imesh->ptr->edge_crease_weights);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->vertex_creases,&imesh->ptr->vertex_creases);
  std::vector<float,_std::allocator<float>_>::vector
            (&this->vertex_crease_weights,&imesh->ptr->vertex_crease_weights);
  pMVar1 = (imesh->ptr->material).ptr;
  (this->material).ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  this->tessellationRate = imesh->ptr->tessellationRate;
  zero_pad_arrays(this);
  return;
}

Assistant:

SubdivMeshNode (Ref<SceneGraph::SubdivMeshNode> imesh, const Transformations& spaces)
        : Node(true),
        time_range(imesh->time_range),
        positions(transformMSMBlurVec3faBuffer(imesh->positions,spaces)),
        normals(transformMSMBlurNormalBuffer(imesh->normals,spaces)),
        texcoords(imesh->texcoords),
        position_indices(imesh->position_indices),
        normal_indices(imesh->normal_indices),
        texcoord_indices(imesh->texcoord_indices),
        position_subdiv_mode(imesh->position_subdiv_mode), 
        normal_subdiv_mode(imesh->normal_subdiv_mode),
        texcoord_subdiv_mode(imesh->texcoord_subdiv_mode),
        verticesPerFace(imesh->verticesPerFace),
        holes(imesh->holes),
        edge_creases(imesh->edge_creases),
        edge_crease_weights(imesh->edge_crease_weights),
        vertex_creases(imesh->vertex_creases),
        vertex_crease_weights(imesh->vertex_crease_weights),
        material(imesh->material), 
        tessellationRate(imesh->tessellationRate)
      {
        zero_pad_arrays();
      }